

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O2

void __thiscall
duckdb::SQLLogicTestLogger::WrongRowCount
          (SQLLogicTestLogger *this,idx_t expected_rows,MaterializedQueryResult *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *comparison_values,idx_t expected_column_count,bool row_wise)

{
  ostream *poVar1;
  allocator local_59;
  idx_t local_58;
  string local_50;
  
  local_58 = expected_column_count;
  std::__cxx11::string::string((string *)&local_50,"Wrong row count in query!",&local_59);
  PrintErrorHeader(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Expected ");
  poVar1 = termcolor::bold(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = termcolor::reset(poVar1);
  poVar1 = std::operator<<(poVar1," rows, but got ");
  poVar1 = termcolor::bold(poVar1);
  duckdb::MaterializedQueryResult::RowCount();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = termcolor::reset(poVar1);
  poVar1 = std::operator<<(poVar1," rows");
  std::endl<char,std::char_traits<char>>(poVar1);
  PrintLineSep();
  PrintSQL(this);
  PrintLineSep();
  PrintResultError(this,result,comparison_values,local_58,row_wise);
  return;
}

Assistant:

void SQLLogicTestLogger::WrongRowCount(idx_t expected_rows, MaterializedQueryResult &result,
                                       const vector<string> &comparison_values, idx_t expected_column_count,
                                       bool row_wise) {
	PrintErrorHeader("Wrong row count in query!");
	std::cerr << "Expected " << termcolor::bold << expected_rows << termcolor::reset << " rows, but got "
	          << termcolor::bold << result.RowCount() << termcolor::reset << " rows" << std::endl;
	PrintLineSep();
	PrintSQL();
	PrintLineSep();
	PrintResultError(result, comparison_values, expected_column_count, row_wise);
}